

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

void __thiscall
IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::throw_on_failure
          (ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *this)

{
  string *text;
  __pointer_type in_RDI;
  string msg;
  string *cur;
  undefined8 in_stack_ffffffffffffffb0;
  memory_order __m;
  __pointer_type this_00;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffc0;
  string local_30 [32];
  __pointer_type local_10;
  
  __m = (memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_10 = std::
             atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::load((atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                     *)in_RDI,__m);
  std::atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  store(in_stack_ffffffffffffffc0,in_RDI,__m);
  if (local_10 != (__pointer_type)0x0) {
    std::__cxx11::string::string(local_30,(string *)local_10);
    this_00 = local_10;
    if (local_10 != (__pointer_type)0x0) {
      std::__cxx11::string::~string((string *)local_10);
      operator_delete(this_00,0x20);
    }
    text = (string *)__cxa_allocate_exception(0x48);
    Iex_3_3::IoExc::IoExc((IoExc *)this_00,text);
    __cxa_throw(text,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
  }
  return;
}

Assistant:

void throw_on_failure ()
    {
        std::string *cur = _first_failure.load ();
        _first_failure.store (nullptr);

        if (cur)
        {
            std::string msg (*cur);
            delete cur;

            throw IEX_NAMESPACE::IoExc (msg);
        }
    }